

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::MoveRegToMemByRegPlusConst::TryToGenerateCode
          (MoveRegToMemByRegPlusConst *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CExpression *pCVar1;
  CTemp *pCVar2;
  CTempExpression *local_1e0;
  CTempExpression *local_1d0;
  CConstExpression *local_1c0;
  CBinopExpression *local_1b0;
  CMemExpression *local_1a0;
  CMoveStatement *local_190;
  undefined1 local_17c [4];
  undefined1 local_178 [16];
  CExpression *local_168;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_160;
  pair<IRT::CTemp,_const_IRT::INode_*> local_138;
  CExpression *local_110;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_108;
  pair<IRT::CTemp,_const_IRT::INode_*> local_e0;
  undefined1 local_a8 [8];
  CTemp rightRegister;
  CTemp leftRegister;
  ConstTempPtr sourceRegPtr;
  ConstTempPtr targetRegPtr;
  ConstConstPtr constPtr;
  ConstBinopPtr binopPtr;
  ConstMemPtr memPtr;
  ConstMovePtr movePtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  MoveRegToMemByRegPlusConst *this_local;
  
  if (tree == (INode *)0x0) {
    local_190 = (CMoveStatement *)0x0;
  }
  else {
    local_190 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
  }
  if (local_190 != (CMoveStatement *)0x0) {
    pCVar1 = CMoveStatement::Target(local_190);
    if (pCVar1 == (CExpression *)0x0) {
      local_1a0 = (CMemExpression *)0x0;
    }
    else {
      local_1a0 = (CMemExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    if (local_1a0 != (CMemExpression *)0x0) {
      pCVar1 = CMemExpression::getAddress(local_1a0);
      if (pCVar1 == (CExpression *)0x0) {
        local_1b0 = (CBinopExpression *)0x0;
      }
      else {
        local_1b0 = (CBinopExpression *)
                    __dynamic_cast(pCVar1,&CExpression::typeinfo,&CBinopExpression::typeinfo,0);
      }
      if (local_1b0 != (CBinopExpression *)0x0) {
        pCVar1 = CBinopExpression::getRightOperand(local_1b0);
        if (pCVar1 == (CExpression *)0x0) {
          local_1c0 = (CConstExpression *)0x0;
        }
        else {
          local_1c0 = (CConstExpression *)
                      __dynamic_cast(pCVar1,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
        }
        if (local_1c0 != (CConstExpression *)0x0) {
          pCVar1 = CBinopExpression::getLeftOperand(local_1b0);
          if (pCVar1 == (CExpression *)0x0) {
            local_1d0 = (CTempExpression *)0x0;
          }
          else {
            local_1d0 = (CTempExpression *)
                        __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
          }
          pCVar1 = CMoveStatement::Source(local_190);
          if (pCVar1 == (CExpression *)0x0) {
            local_1e0 = (CTempExpression *)0x0;
          }
          else {
            local_1e0 = (CTempExpression *)
                        __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
          }
          CTemp::CTemp((CTemp *)&rightRegister.field_0x18);
          CTemp::CTemp((CTemp *)local_a8);
          if (local_1d0 == (CTempExpression *)0x0) {
            local_110 = CBinopExpression::getLeftOperand(local_1b0);
            std::make_pair<IRT::CTemp&,IRT::CExpression_const*>
                      (&local_108,(CTemp *)&rightRegister.field_0x18,&local_110);
            std::pair<IRT::CTemp,_const_IRT::INode_*>::
            pair<IRT::CTemp,_const_IRT::CExpression_*,_true>(&local_e0,&local_108);
            std::
            vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
            ::push_back(children,&local_e0);
            std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_e0);
            std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_108);
          }
          else {
            pCVar2 = CTempExpression::getTemprorary(local_1d0);
            CTemp::operator=((CTemp *)&rightRegister.field_0x18,pCVar2);
          }
          if (local_1e0 == (CTempExpression *)0x0) {
            local_168 = CMoveStatement::Source(local_190);
            std::make_pair<IRT::CTemp&,IRT::CExpression_const*>
                      (&local_160,(CTemp *)local_a8,&local_168);
            std::pair<IRT::CTemp,_const_IRT::INode_*>::
            pair<IRT::CTemp,_const_IRT::CExpression_*,_true>(&local_138,&local_160);
            std::
            vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
            ::push_back(children,&local_138);
            std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_138);
            std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_160);
          }
          else {
            pCVar2 = CTempExpression::getTemprorary(local_1e0);
            CTemp::operator=((CTemp *)local_a8,pCVar2);
          }
          local_17c = (undefined1  [4])CConstExpression::getValue(local_1c0);
          std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst,IRT::CTemp&,int,IRT::CTemp&>
                    ((CTemp *)local_178,(int *)&rightRegister.field_0x18,(CTemp *)local_17c);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)commands,(shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst> *)local_178);
          std::shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst>::~shared_ptr
                    ((shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst> *)local_178);
          CTemp::~CTemp((CTemp *)local_a8);
          CTemp::~CTemp((CTemp *)&rightRegister.field_0x18);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IRT::MoveRegToMemByRegPlusConst::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(movePtr->Target( ));
        if ( memPtr ) {
            ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(memPtr->getAddress( ));
            if ( binopPtr ) {
                ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(binopPtr->getRightOperand( ));
                if ( constPtr ) {
                    ConstTempPtr targetRegPtr = dynamic_cast<ConstTempPtr>(binopPtr->getLeftOperand( ));
                    ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(movePtr->Source( ));
                    CTemp leftRegister;
                    CTemp rightRegister;
                    if ( !targetRegPtr ) {
                        children.push_back( std::make_pair( leftRegister, binopPtr->getLeftOperand( )));
                    } else {
                        leftRegister = targetRegPtr->getTemprorary( );
                    }
                    if ( !sourceRegPtr ) {
                        children.push_back( std::make_pair( rightRegister, movePtr->Source( )));
                    } else {
                        rightRegister = sourceRegPtr->getTemprorary( );
                    }
                    commands.emplace_back( std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst>( leftRegister,
                                                                                                       constPtr->getValue( ),
                                                                                                       rightRegister ));
                    return true;
                }
            }
        }
    }
    return false;
}